

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addLinkageDecoration(Builder *this,Id id,char *name,LinkageType linkType)

{
  Instruction *this_00;
  value_type local_38;
  Instruction *local_30;
  Instruction *dec;
  char *pcStack_20;
  LinkageType linkType_local;
  char *name_local;
  Builder *pBStack_10;
  Id id_local;
  Builder *this_local;
  
  dec._4_4_ = linkType;
  pcStack_20 = name;
  name_local._4_4_ = id;
  pBStack_10 = this;
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,OpDecorate);
  local_30 = this_00;
  spv::Instruction::reserveOperands(this_00,4);
  spv::Instruction::addIdOperand(local_30,name_local._4_4_);
  spv::Instruction::addImmediateOperand(local_30,0x29);
  spv::Instruction::addStringOperand(local_30,pcStack_20);
  spv::Instruction::addImmediateOperand(local_30,dec._4_4_);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             local_30);
  std::
  set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::insert(&this->decorations,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  return;
}

Assistant:

void Builder::addLinkageDecoration(Id id, const char* name, spv::LinkageType linkType) {
    Instruction* dec = new Instruction(OpDecorate);
    dec->reserveOperands(4);
    dec->addIdOperand(id);
    dec->addImmediateOperand(spv::DecorationLinkageAttributes);
    dec->addStringOperand(name);
    dec->addImmediateOperand(linkType);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}